

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::MaybeInvalidatePropertyCache(cmTarget *this,string *prop)

{
  bool bVar1;
  cmTargetInternals *pcVar2;
  bool local_92;
  bool local_72;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *prop_local;
  cmTarget *this_local;
  
  local_18 = prop;
  prop_local = (string *)this;
  bVar1 = IsImported(this);
  local_39 = 0;
  local_72 = false;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,(string *)local_18);
    local_39 = 1;
    local_72 = cmHasLiteralPrefix<std::__cxx11::string,9ul>(&local_38,(char (*) [9])0x8c8504);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (local_72 != false) {
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
    ::clear(&pcVar2->ImportInfoMap);
  }
  bVar1 = IsImported(this);
  local_92 = false;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_70,(string *)local_18);
    local_92 = cmHasLiteralPrefix<std::__cxx11::string,16ul>
                         (&local_70,(char (*) [16])"LINK_INTERFACE_");
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (local_92 != false) {
    ClearLinkMaps(this);
  }
  return;
}

Assistant:

void cmTarget::MaybeInvalidatePropertyCache(const std::string& prop)
{
  // Wipe out maps caching information affected by this property.
  if(this->IsImported() && cmHasLiteralPrefix(prop, "IMPORTED"))
    {
    this->Internal->ImportInfoMap.clear();
    }
  if(!this->IsImported() && cmHasLiteralPrefix(prop, "LINK_INTERFACE_"))
    {
    this->ClearLinkMaps();
    }
}